

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_server_async.cpp
# Opt level: O0

void __thiscall Session::DoWrite(Session *this,size_t length)

{
  enable_shared_from_this<Session> local_68;
  code *local_58;
  undefined8 local_50;
  type local_48;
  mutable_buffer local_28;
  size_t local_18;
  size_t length_local;
  Session *this_local;
  
  local_18 = length;
  length_local = (size_t)this;
  local_28 = boost::asio::buffer<char,1024ul>(&this->buffer_,length);
  local_58 = OnWrite;
  local_50 = 0;
  std::enable_shared_from_this<Session>::shared_from_this(&local_68);
  std::
  bind<void(Session::*)(boost::system::error_code,unsigned_long),std::shared_ptr<Session>,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
            (&local_48,(offset_in_Session_to_subr *)&local_58,(shared_ptr<Session> *)&local_68,
             (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2);
  boost::asio::
  async_write<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::mutable_buffer,std::_Bind<void(Session::*(std::shared_ptr<Session>,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code,unsigned_long)>>
            (&this->socket_,&local_28,&local_48,(type *)0x0);
  std::
  _Bind<void_(Session::*(std::shared_ptr<Session>,_std::_Placeholder<1>,_std::_Placeholder<2>))(boost::system::error_code,_unsigned_long)>
  ::~_Bind(&local_48);
  std::shared_ptr<Session>::~shared_ptr((shared_ptr<Session> *)&local_68);
  return;
}

Assistant:

void DoWrite(std::size_t length) {
#if USE_BIND
    boost::asio::async_write(socket_,
                             boost::asio::buffer(buffer_, length),
                             std::bind(&Session::OnWrite, shared_from_this(),
                                       std::placeholders::_1,
                                       std::placeholders::_2));
#else
    auto self(shared_from_this());

    boost::asio::async_write(
        socket_,
        boost::asio::buffer(buffer_, length),
        [this, self](boost::system::error_code ec, std::size_t /*length*/) {
          if (!ec) {
            AsyncRead();
          }
        });
#endif  // USE_BIND
  }